

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqResWithDeletion.cpp
# Opt level: O2

bool __thiscall Shell::EqResWithDeletion::apply(EqResWithDeletion *this,UnitList **units)

{
  Clause *cl;
  List<Kernel::Unit_*> **ppLVar1;
  Clause *pCVar2;
  UnitList *pUVar3;
  bool bVar4;
  
  pUVar3 = (UnitList *)0x0;
  bVar4 = false;
  while( true ) {
    ppLVar1 = &pUVar3->_tail;
    if (pUVar3 == (UnitList *)0x0) {
      ppLVar1 = units;
    }
    pUVar3 = *ppLVar1;
    if (pUVar3 == (UnitList *)0x0) break;
    cl = (Clause *)pUVar3->_head;
    pCVar2 = apply(this,cl);
    if (cl != pCVar2) {
      pUVar3->_head = &pCVar2->super_Unit;
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool EqResWithDeletion::apply(UnitList*& units)
{
  bool modified = false;

  UnitList::DelIterator uit(units);
  while(uit.hasNext()) {
    Clause* cl=static_cast<Clause*>(uit.next());
    ASS(cl->isClause());
    Clause* cl2=apply(cl);
    if(cl!=cl2) {
      modified = true;
      uit.replace(cl2);
    }
  }
  return modified;
}